

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> __thiscall
IRT::CLabelStatement::CastCopy(CLabelStatement *this)

{
  CLabelStatement *this_00;
  long in_RSI;
  CLabel local_40;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
  local_20 [2];
  CLabelStatement *this_local;
  
  this_local = this;
  this_00 = (CLabelStatement *)operator_new(0x28);
  CLabel::CLabel(&local_40,(CLabel *)(in_RSI + 8));
  CLabelStatement(this_00,&local_40);
  std::unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>::
  unique_ptr<std::default_delete<IRT::CLabelStatement_const>,void>
            ((unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>
              *)local_20,this_00);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)this,local_20);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr(local_20);
  CLabel::~CLabel(&local_40);
  return (__uniq_ptr_data<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CLabelStatement> CLabelStatement::CastCopy( ) const {
    return std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( label )));
}